

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

Vec_Int_t * Gia_ManTransfer(Gia_Man_t *pAig,Gia_Man_t *pCof,Gia_Man_t *pNew,Vec_Int_t *vSigs)

{
  int iVar1;
  Vec_Int_t *p;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_44;
  int i;
  Gia_Obj_t *pObjF;
  Gia_Obj_t *pObj;
  Vec_Int_t *vSigsNew;
  Vec_Int_t *vSigs_local;
  Gia_Man_t *pNew_local;
  Gia_Man_t *pCof_local;
  Gia_Man_t *pAig_local;
  
  p = Vec_IntAlloc(100);
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vSigs);
    bVar3 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vSigs,local_44);
      pObjF = Gia_ManObj(pAig,iVar1);
      bVar3 = pObjF != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsCand(pObjF);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsCand(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                    ,0x395,
                    "Vec_Int_t *Gia_ManTransfer(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Abc_Lit2Var(pObjF->Value);
    pGVar2 = Gia_ManObj(pCof,iVar1);
    if ((pGVar2->Value != 0) && (pGVar2->Value != 0xffffffff)) {
      iVar1 = Abc_Lit2Var(pGVar2->Value);
      Vec_IntPushUnique(p,iVar1);
    }
    local_44 = local_44 + 1;
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_ManTransfer( Gia_Man_t * pAig, Gia_Man_t * pCof, Gia_Man_t * pNew, Vec_Int_t * vSigs )
{
    Vec_Int_t * vSigsNew;
    Gia_Obj_t * pObj, * pObjF;
    int i;
    vSigsNew = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vSigs, pAig, pObj, i )
    {
        assert( Gia_ObjIsCand(pObj) );
        pObjF = Gia_ManObj( pCof, Abc_Lit2Var(pObj->Value) );
        if ( pObjF->Value && ~pObjF->Value )
            Vec_IntPushUnique( vSigsNew, Abc_Lit2Var(pObjF->Value) );
    }
    return vSigsNew;    
}